

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O2

void __thiscall ChatRoom::broadcast(ChatRoom *this,string *origin,string *message)

{
  pointer psVar1;
  bool bVar2;
  shared_ptr<Person> *p;
  pointer psVar3;
  
  psVar1 = (this->m_people).
           super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->m_people).
                super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    bVar2 = std::operator!=(&((psVar3->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->m_name,origin);
    if (bVar2) {
      Person::recieve((psVar3->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,origin
                      ,message);
    }
  }
  return;
}

Assistant:

void ChatRoom::broadcast(const std::string& origin, const std::string& message)
{
	for(auto& p : m_people)
	{
		if(p->m_name != origin)
		{
			p->recieve(origin, message);
		}
	}
}